

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void state_SINCOS(Context *ctx)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  
  if ((ctx->dest_arg).writemask - 1U < 3) {
    uVar1 = ctx->source_args[0].swizzle;
    uVar3 = uVar1 >> 2 & 3;
    if ((((uVar1 & 3) == uVar3) && (uVar4 = uVar1 >> 4 & 3, uVar3 == uVar4)) &&
       (uVar4 == (uVar1 >> 6 & 3))) {
      if (((ctx->dest_arg).result_mod & 1) == 0) {
        if (ctx->major_ver < 3) {
          uVar5 = 1;
          lVar2 = 0x1c4;
          do {
            if (*(int *)((long)&ctx->isfail + lVar2) != 2) {
              failf(ctx,"SINCOS src%d must be constfloat",uVar5);
              return;
            }
            uVar5 = (ulong)((int)uVar5 + 1);
            lVar2 = lVar2 + 0x40;
          } while (lVar2 != 0x244);
          if (ctx->source_args[1].regnum == ctx->source_args[2].regnum) {
            pcVar6 = "SINCOS src1 and src2 must be different registers";
            goto LAB_00113c7b;
          }
        }
        return;
      }
      pcVar6 = "SINCOS destination can\'t use saturate modifier";
    }
    else {
      pcVar6 = "SINCOS src0 must have replicate swizzle";
    }
  }
  else {
    pcVar6 = "SINCOS write mask must be .x or .y or .xy";
  }
LAB_00113c7b:
  failf(ctx,"%s",pcVar6);
  return;
}

Assistant:

static void state_SINCOS(Context *ctx)
{
    const DestArgInfo *dst = &ctx->dest_arg;
    const int mask = dst->writemask;
    if (!writemask_x(mask) && !writemask_y(mask) && !writemask_xy(mask))
        fail(ctx, "SINCOS write mask must be .x or .y or .xy");

    else if (!replicate_swizzle(ctx->source_args[0].swizzle))
        fail(ctx, "SINCOS src0 must have replicate swizzle");

    else if (dst->result_mod & MOD_SATURATE)  // according to msdn...
        fail(ctx, "SINCOS destination can't use saturate modifier");

    // this opcode needs extra registers, with extra limitations, for <= sm2.
    else if (!shader_version_atleast(ctx, 3, 0))
    {
        int i;
        for (i = 1; i < 3; i++)
        {
            if (ctx->source_args[i].regtype != REG_TYPE_CONST)
            {
                failf(ctx, "SINCOS src%d must be constfloat", i);
                return;
            } // if
        } // for

        if (ctx->source_args[1].regnum == ctx->source_args[2].regnum)
            fail(ctx, "SINCOS src1 and src2 must be different registers");
    } // if
}